

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_1.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  MemSegment *pMVar1;
  void *pvVar2;
  undefined8 *ptr_00;
  byte bVar3;
  void *ptr;
  NoActionMemLogger logger;
  FixedArena arena;
  char buffer [64000];
  NoActionMemLogger local_fc91;
  FixedArena local_fc90;
  undefined **local_fc78;
  FixedArena *local_fc70;
  NoActionMemLogger *local_fc68;
  MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> local_fc60;
  undefined1 local_fa18 [64000];
  
  local_fc70 = &local_fc90;
  local_fc90.m_used = false;
  local_fc90.m_page = local_fa18;
  local_fc90.m_size = 64000;
  local_fc78 = &PTR__MemContext_00105d90;
  local_fc68 = &local_fc91;
  local_fc60.m_arena = local_fc70;
  local_fc60.m_logger = local_fc68;
  memset(&local_fc60.m_footprintLimit,0,0x232);
  local_fc60.m_paddingByte = -0x33;
  pvVar2 = cookmem::MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::allocate
                     (&local_fc60,100);
  cookmem::MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::deallocate
            (&local_fc60,pvVar2,0);
  ptr_00 = (undefined8 *)
           cookmem::MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::allocate
                     (&local_fc60,100);
  if (ptr_00 != (undefined8 *)0x0) {
    ptr_00[10] = 0;
    ptr_00[0xb] = 0;
    ptr_00[8] = 0;
    ptr_00[9] = 0;
    ptr_00[6] = 0;
    ptr_00[7] = 0;
    ptr_00[4] = 0;
    ptr_00[5] = 0;
    ptr_00[2] = 0;
    ptr_00[3] = 0;
    *ptr_00 = 0;
    ptr_00[1] = 0;
    *(undefined4 *)(ptr_00 + 0xc) = 0;
  }
  pvVar2 = cookmem::MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::reallocate
                     (&local_fc60,ptr_00,1000);
  cookmem::MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::deallocate
            (&local_fc60,pvVar2,0);
  if (local_fc60.m_segList != (MemSegment *)0x0) {
    bVar3 = (local_fc60.m_arena)->m_used;
    do {
      pMVar1 = (local_fc60.m_segList)->m_next;
      if ((((bVar3 & 1) != 0) &&
          ((MemSegment *)(local_fc60.m_arena)->m_page == local_fc60.m_segList)) &&
         ((local_fc60.m_arena)->m_size == (local_fc60.m_segList)->m_size)) {
        (local_fc60.m_arena)->m_used = false;
        bVar3 = 0;
      }
      local_fc60.m_segList = pMVar1;
    } while (pMVar1 != (MemSegment *)0x0);
  }
  return 0;
}

Assistant:

int
main (int argc, const char* argv[])
{
    char buffer[64000];
    cookmem::FixedArena arena (buffer, sizeof(buffer));
    cookmem::NoActionMemLogger logger;
    cookmem::MemContext<cookmem::FixedArena, cookmem::NoActionMemLogger> memCtx (arena, logger);

    // Allocate memory
    void* ptr = memCtx.allocate (100);

    // Free the memory
    memCtx.deallocate (ptr);

    // Much like calloc in c, allocate 100 bytes which is set to 0.
    ptr = memCtx.callocate (1, 100);

    // Change the size of the memory
    ptr = memCtx.reallocate (ptr, 1000);

    // Free the memory
    memCtx.deallocate (ptr);

    return 0;
}